

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

size_t Assimp::Ogre::VertexElement::ComponentCount(Type type)

{
  if (type < (VET_UINT1|VET_COLOUR)) {
    return *(size_t *)(&DAT_006e9100 + (ulong)type * 8);
  }
  return 0;
}

Assistant:

size_t VertexElement::ComponentCount(Type type)
{
    switch(type)
    {
        case VET_COLOUR:
        case VET_COLOUR_ABGR:
        case VET_COLOUR_ARGB:
        case VET_FLOAT1:
        case VET_DOUBLE1:
        case VET_SHORT1:
        case VET_USHORT1:
        case VET_INT1:
        case VET_UINT1:
            return 1;
        case VET_FLOAT2:
        case VET_DOUBLE2:
        case VET_SHORT2:
        case VET_USHORT2:
        case VET_INT2:
        case VET_UINT2:
            return 2;
        case VET_FLOAT3:
        case VET_DOUBLE3:
        case VET_SHORT3:
        case VET_USHORT3:
        case VET_INT3:
        case VET_UINT3:
            return 3;
        case VET_FLOAT4:
        case VET_DOUBLE4:
        case VET_SHORT4:
        case VET_USHORT4:
        case VET_INT4:
        case VET_UINT4:
        case VET_UBYTE4:
            return 4;
    }
    return 0;
}